

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O2

void Abc_ExactStop(char *pFilename)

{
  Ses_TimesEntry_t *pSVar1;
  Ses_TruthEntry_t *pSVar2;
  Ses_Store_t *__ptr;
  int in_ECX;
  int in_EDX;
  int in_R8D;
  int in_R9D;
  long lVar3;
  Ses_TruthEntry_t *__ptr_00;
  Ses_TimesEntry_t *__ptr_01;
  
  if (s_pSesStore != (Ses_Store_t *)0x0) {
    if (pFilename != (char *)0x0) {
      Ses_StoreWrite(s_pSesStore,pFilename,in_EDX,in_ECX,in_R8D,in_R9D);
    }
    if ((FILE *)s_pSesStore->pDebugEntries != (FILE *)0x0) {
      fclose((FILE *)s_pSesStore->pDebugEntries);
    }
    __ptr = s_pSesStore;
    for (lVar3 = 0; lVar3 != 0x400; lVar3 = lVar3 + 1) {
      __ptr_00 = __ptr->pEntries[lVar3];
      if (__ptr->pEntries[lVar3] != (Ses_TruthEntry_t *)0x0) {
        while (__ptr_00 != (Ses_TruthEntry_t *)0x0) {
          __ptr_01 = __ptr_00->head;
          while (__ptr_01 != (Ses_TimesEntry_t *)0x0) {
            free(__ptr_01->pNetwork);
            pSVar1 = __ptr_01->next;
            free(__ptr_01);
            __ptr_01 = pSVar1;
          }
          pSVar2 = __ptr_00->next;
          free(__ptr_00);
          __ptr_00 = pSVar2;
        }
      }
    }
    sat_solver_delete(__ptr->pSat);
    free(__ptr->szDBName);
    free(__ptr);
    return;
  }
  puts("BMS manager has not been started");
  return;
}

Assistant:

void Abc_ExactStop( const char * pFilename )
{
    if ( s_pSesStore )
    {
        if ( pFilename )
            Ses_StoreWrite( s_pSesStore, pFilename, 1, 0, 0, 0 );
        if ( s_pSesStore->pDebugEntries )
            fclose( s_pSesStore->pDebugEntries );
        Ses_StoreClean( s_pSesStore );
    }
    else
        printf( "BMS manager has not been started\n" );
}